

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O1

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getuntil
          (kstream<gzFile_s_*,_FunctorZlib> *this,Delimiter delimiter,string *str,int *dret)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (str->_M_string_length != 0) {
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
  }
  if ((this->begin < this->end) || (iVar5 = -1, this->is_eof == 0)) {
    do {
      if (this->end <= this->begin) {
        if (this->is_eof != 0) break;
        this->begin = 0;
        uVar2 = gzread(this->f,this->buf,this->bufferSize);
        this->end = uVar2;
        if (uVar2 < this->bufferSize) {
          this->is_eof = 1;
        }
        if (uVar2 == 0) break;
      }
      if (delimiter == SPACE) {
        iVar5 = this->begin;
        iVar1 = this->end;
        iVar6 = iVar5;
        if (iVar5 < iVar1) {
          pcVar4 = this->buf + iVar5;
          do {
            iVar3 = isspace((int)*pcVar4);
            iVar6 = iVar5;
            if (iVar3 != 0) break;
            iVar5 = iVar5 + 1;
            pcVar4 = pcVar4 + 1;
            iVar6 = iVar1;
          } while (iVar1 != iVar5);
        }
      }
      else {
        iVar6 = 0;
        if (delimiter == EOL) {
          iVar5 = this->begin;
          iVar1 = this->end;
          iVar6 = iVar5;
          if (iVar5 < iVar1) {
            pcVar4 = this->buf + iVar5;
            do {
              iVar6 = iVar5;
              if (*pcVar4 == '\n') break;
              iVar5 = iVar5 + 1;
              pcVar4 = pcVar4 + 1;
              iVar6 = iVar1;
            } while (iVar1 != iVar5);
          }
        }
      }
      std::__cxx11::string::append((char *)str,(ulong)(this->buf + this->begin));
      this->begin = iVar6 + 1;
      if ((dret != (int *)0x0) && (iVar6 < this->end)) {
        *dret = (int)this->buf[iVar6];
        break;
      }
    } while (this->end <= iVar6);
    iVar5 = (int)str->_M_string_length;
  }
  return iVar5;
}

Assistant:

int getuntil(Delimiter delimiter, std::string &str, int *dret)
    {
        if (dret)
            *dret = 0;
        if (!str.empty()) {
            str.clear();
        }

        if (this->begin >= this->end && this->is_eof)
            return -1;
        for (;;)
        {
            int i;
            if (this->begin >= this->end)
            {
                if (!this->is_eof)
                {
                    this->begin = 0;
                    this->end = this->readfunc(this->f, this->buf, bufferSize);
                    if (this->end < bufferSize)
                        this->is_eof = 1;
                    if (this->end == 0)
                        break;
                }
                else
                    break;
            }
            if (delimiter == EOL)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (this->buf[i] == '\n')
                        break;
                }
            }
            else if (delimiter == SPACE)
            {
                for (i = this->begin; i < this->end; ++i)
                {
                    if (isspace(this->buf[i]))
                        break;
                }
            }
            else i = 0;

            str.append(this->buf + this->begin, static_cast<unsigned long>(i - this->begin));
            this->begin = i + 1;
            if (i < this->end)
            {
                if (dret)
                    *dret = this->buf[i];
                break;
            }
        }
        return (int)str.length();
    }